

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O1

int32_t __thiscall icu_63::ChineseCalendar::handleGetExtendedYear(ChineseCalendar *this)

{
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  
  iVar3 = 1;
  iVar1 = Calendar::newestStamp(&this->super_Calendar,UCAL_ERA,UCAL_YEAR,0);
  if ((this->super_Calendar).fStamp[0x13] < iVar1) {
    iVar4 = 0;
    if (0 < (this->super_Calendar).fStamp[0]) {
      iVar4 = (this->super_Calendar).fFields[0] * 0x3c + -0x3c;
    }
    iVar2 = -0xa4b;
    if (0 < (this->super_Calendar).fStamp[1]) {
      iVar2 = (this->super_Calendar).fFields[1] + -0xa4c;
    }
    iVar3 = (iVar2 + iVar4) - *(int *)&(this->super_Calendar).field_0x264;
  }
  else if (0 < (this->super_Calendar).fStamp[0x13]) {
    iVar3 = (this->super_Calendar).fFields[0x13];
  }
  return iVar3;
}

Assistant:

int32_t ChineseCalendar::handleGetExtendedYear() {
    int32_t year;
    if (newestStamp(UCAL_ERA, UCAL_YEAR, kUnset) <= fStamp[UCAL_EXTENDED_YEAR]) {
        year = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        int32_t cycle = internalGet(UCAL_ERA, 1) - 1; // 0-based cycle
        // adjust to the instance specific epoch
        year = cycle * 60 + internalGet(UCAL_YEAR, 1) - (fEpochYear - CHINESE_EPOCH_YEAR);
    }
    return year;
}